

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void av1_highbd_iwht4x4_16_add_sse4_1(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  long lVar1;
  short *psVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar12;
  int iVar13;
  undefined1 auVar9 [16];
  int iVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar15;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  short sVar39;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  undefined1 auVar40 [16];
  short sVar47;
  undefined1 auVar48 [16];
  int iVar49;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  
  auVar11._0_4_ = *input >> 2;
  auVar11._4_4_ = input[1] >> 2;
  auVar11._8_4_ = input[2] >> 2;
  auVar11._12_4_ = input[3] >> 2;
  auVar19._0_4_ = input[4] >> 2;
  auVar19._4_4_ = input[5] >> 2;
  auVar19._8_4_ = input[6] >> 2;
  auVar19._12_4_ = input[7] >> 2;
  auVar9._0_4_ = input[8] >> 2;
  auVar9._4_4_ = input[9] >> 2;
  auVar9._8_4_ = input[10] >> 2;
  auVar9._12_4_ = input[0xb] >> 2;
  auVar18._0_4_ = input[0xc] >> 2;
  auVar18._4_4_ = input[0xd] >> 2;
  auVar18._8_4_ = input[0xe] >> 2;
  auVar18._12_4_ = input[0xf] >> 2;
  iVar7 = 1;
  do {
    iVar15 = auVar11._0_4_ + auVar19._0_4_;
    iVar20 = auVar11._4_4_ + auVar19._4_4_;
    iVar21 = auVar11._8_4_ + auVar19._8_4_;
    iVar22 = auVar11._12_4_ + auVar19._12_4_;
    iVar49 = auVar9._0_4_ - auVar18._0_4_;
    iVar51 = auVar9._4_4_ - auVar18._4_4_;
    iVar52 = auVar9._8_4_ - auVar18._8_4_;
    iVar53 = auVar9._12_4_ - auVar18._12_4_;
    iVar8 = iVar15 - iVar49 >> 1;
    iVar12 = iVar20 - iVar51 >> 1;
    iVar13 = iVar21 - iVar52 >> 1;
    iVar14 = iVar22 - iVar53 >> 1;
    auVar40._0_4_ = iVar8 - auVar18._0_4_;
    auVar40._4_4_ = iVar12 - auVar18._4_4_;
    auVar40._8_4_ = iVar13 - auVar18._8_4_;
    auVar40._12_4_ = iVar14 - auVar18._12_4_;
    iVar8 = iVar8 - auVar19._0_4_;
    iVar12 = iVar12 - auVar19._4_4_;
    auVar9._0_8_ = CONCAT44(iVar12,iVar8);
    auVar9._8_4_ = iVar13 - auVar19._8_4_;
    auVar9._12_4_ = iVar14 - auVar19._12_4_;
    iVar15 = iVar15 - auVar40._0_4_;
    iVar20 = iVar20 - auVar40._4_4_;
    auVar16._0_8_ = CONCAT44(iVar20,iVar15);
    auVar16._8_4_ = iVar21 - auVar40._8_4_;
    auVar16._12_4_ = iVar22 - auVar40._12_4_;
    auVar18._0_4_ = iVar49 + iVar8;
    auVar18._4_4_ = iVar51 + iVar12;
    auVar18._8_4_ = iVar52 + auVar9._8_4_;
    auVar18._12_4_ = iVar53 + auVar9._12_4_;
    auVar11 = auVar16;
    auVar10 = auVar19;
    if (iVar7 == 1) {
      auVar48._8_4_ = iVar20;
      auVar48._0_8_ = auVar16._0_8_;
      auVar48._12_4_ = auVar40._4_4_;
      auVar11._4_4_ = auVar40._0_4_;
      auVar11._0_4_ = iVar15;
      auVar50._8_4_ = iVar12;
      auVar50._0_8_ = auVar9._0_8_;
      auVar50._12_4_ = auVar18._4_4_;
      auVar11._12_4_ = auVar18._0_4_;
      auVar11._8_4_ = iVar8;
      auVar17._0_8_ = CONCAT44(auVar40._8_4_,auVar16._8_4_);
      auVar17._8_4_ = auVar16._12_4_;
      auVar17._12_4_ = auVar40._12_4_;
      auVar10._0_8_ = CONCAT44(auVar18._8_4_,auVar9._8_4_);
      auVar10._8_4_ = auVar9._12_4_;
      auVar10._12_4_ = auVar18._12_4_;
      auVar40._8_8_ = auVar50._8_8_;
      auVar40._0_8_ = auVar48._8_8_;
      auVar9._8_8_ = auVar10._0_8_;
      auVar9._0_8_ = auVar17._0_8_;
      auVar18._8_8_ = auVar10._8_8_;
      auVar18._0_8_ = auVar17._8_8_;
      auVar10 = auVar40;
    }
    iVar7 = iVar7 + -1;
    auVar19 = auVar40;
  } while (iVar7 == 0);
  auVar19 = packssdw(auVar11,auVar40);
  auVar11 = packssdw(auVar9,auVar18);
  uVar4 = *(undefined8 *)((long)stride * 2 + (long)dest8 * 2);
  uVar5 = *(undefined8 *)((long)dest8 * 2);
  sVar23 = (short)uVar5 + auVar19._0_2_;
  sVar25 = (short)((ulong)uVar5 >> 0x10) + auVar19._2_2_;
  sVar27 = (short)((ulong)uVar5 >> 0x20) + auVar19._4_2_;
  sVar29 = (short)((ulong)uVar5 >> 0x30) + auVar19._6_2_;
  sVar31 = (short)uVar4 + auVar19._8_2_;
  sVar33 = (short)((ulong)uVar4 >> 0x10) + auVar19._10_2_;
  sVar35 = (short)((ulong)uVar4 >> 0x20) + auVar19._12_2_;
  sVar37 = (short)((ulong)uVar4 >> 0x30) + auVar19._14_2_;
  lVar6 = (long)(stride * 2) * 2;
  lVar3 = (long)(stride * 3) * 2;
  uVar4 = *(undefined8 *)(lVar6 + (long)dest8 * 2);
  uVar5 = *(undefined8 *)(lVar3 + (long)dest8 * 2);
  auVar19 = pmovsxbw(auVar10,0x101010101010101);
  auVar19 = psllw(auVar19,ZEXT416((uint)bd));
  sVar39 = auVar19._0_2_ + -1;
  sVar41 = auVar19._2_2_ + -1;
  sVar42 = auVar19._4_2_ + -1;
  sVar43 = auVar19._6_2_ + -1;
  sVar44 = auVar19._8_2_ + -1;
  sVar45 = auVar19._10_2_ + -1;
  sVar46 = auVar19._12_2_ + -1;
  sVar47 = auVar19._14_2_ + -1;
  uVar24 = (ushort)(sVar39 < sVar23) * sVar39 | (ushort)(sVar39 >= sVar23) * sVar23;
  uVar26 = (ushort)(sVar41 < sVar25) * sVar41 | (ushort)(sVar41 >= sVar25) * sVar25;
  uVar28 = (ushort)(sVar42 < sVar27) * sVar42 | (ushort)(sVar42 >= sVar27) * sVar27;
  uVar30 = (ushort)(sVar43 < sVar29) * sVar43 | (ushort)(sVar43 >= sVar29) * sVar29;
  uVar32 = (ushort)(sVar44 < sVar31) * sVar44 | (ushort)(sVar44 >= sVar31) * sVar31;
  uVar34 = (ushort)(sVar45 < sVar33) * sVar45 | (ushort)(sVar45 >= sVar33) * sVar33;
  uVar36 = (ushort)(sVar46 < sVar35) * sVar46 | (ushort)(sVar46 >= sVar35) * sVar35;
  uVar38 = (ushort)(sVar47 < sVar37) * sVar47 | (ushort)(sVar47 >= sVar37) * sVar37;
  psVar2 = (short *)((long)dest8 * 2);
  *psVar2 = (-1 < (short)uVar24) * uVar24;
  psVar2[1] = (-1 < (short)uVar26) * uVar26;
  psVar2[2] = (-1 < (short)uVar28) * uVar28;
  psVar2[3] = (-1 < (short)uVar30) * uVar30;
  lVar1 = (long)stride * 2 + (long)dest8 * 2;
  *(ushort *)(lVar1 + 8) = (-1 < (short)uVar32) * uVar32;
  *(ushort *)(lVar1 + 10) = (-1 < (short)uVar34) * uVar34;
  *(ushort *)(lVar1 + 0xc) = (-1 < (short)uVar36) * uVar36;
  *(ushort *)(lVar1 + 0xe) = (-1 < (short)uVar38) * uVar38;
  sVar23 = (short)uVar4 + auVar11._0_2_;
  sVar25 = (short)((ulong)uVar4 >> 0x10) + auVar11._2_2_;
  sVar27 = (short)((ulong)uVar4 >> 0x20) + auVar11._4_2_;
  sVar29 = (short)((ulong)uVar4 >> 0x30) + auVar11._6_2_;
  sVar31 = (short)uVar5 + auVar11._8_2_;
  sVar33 = (short)((ulong)uVar5 >> 0x10) + auVar11._10_2_;
  sVar35 = (short)((ulong)uVar5 >> 0x20) + auVar11._12_2_;
  sVar37 = (short)((ulong)uVar5 >> 0x30) + auVar11._14_2_;
  uVar24 = (ushort)(sVar23 < sVar39) * sVar23 | (ushort)(sVar23 >= sVar39) * sVar39;
  uVar26 = (ushort)(sVar25 < sVar41) * sVar25 | (ushort)(sVar25 >= sVar41) * sVar41;
  uVar28 = (ushort)(sVar27 < sVar42) * sVar27 | (ushort)(sVar27 >= sVar42) * sVar42;
  uVar30 = (ushort)(sVar29 < sVar43) * sVar29 | (ushort)(sVar29 >= sVar43) * sVar43;
  uVar32 = (ushort)(sVar31 < sVar44) * sVar31 | (ushort)(sVar31 >= sVar44) * sVar44;
  uVar34 = (ushort)(sVar33 < sVar45) * sVar33 | (ushort)(sVar33 >= sVar45) * sVar45;
  uVar36 = (ushort)(sVar35 < sVar46) * sVar35 | (ushort)(sVar35 >= sVar46) * sVar46;
  uVar38 = (ushort)(sVar37 < sVar47) * sVar37 | (ushort)(sVar37 >= sVar47) * sVar47;
  psVar2 = (short *)(lVar6 + (long)dest8 * 2);
  *psVar2 = (-1 < (short)uVar24) * uVar24;
  psVar2[1] = (-1 < (short)uVar26) * uVar26;
  psVar2[2] = (-1 < (short)uVar28) * uVar28;
  psVar2[3] = (-1 < (short)uVar30) * uVar30;
  lVar3 = lVar3 + (long)dest8 * 2;
  *(ushort *)(lVar3 + 8) = (-1 < (short)uVar32) * uVar32;
  *(ushort *)(lVar3 + 10) = (-1 < (short)uVar34) * uVar34;
  *(ushort *)(lVar3 + 0xc) = (-1 < (short)uVar36) * uVar36;
  *(ushort *)(lVar3 + 0xe) = (-1 < (short)uVar38) * uVar38;
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_sse4_1(const tran_low_t *input, uint8_t *dest8,
                                      int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  __m128i op[4];
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  load_buffer_4x4(input, op);

  // Shift before-hand.
  op[0] = _mm_srai_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_srai_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_srai_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_srai_epi32(op[3], UNIT_QUANT_SHIFT);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i c1 = op[1];
    __m128i d1 = op[2];
    __m128i b1 = op[3];
    a1 = _mm_add_epi32(a1, c1);          // a1 += c1
    d1 = _mm_sub_epi32(d1, b1);          // d1 -= b1
    __m128i e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, b1);  // a1 -= b1
    d1 = _mm_add_epi32(d1, c1);  // d1 += c1

    op[0] = a1;
    op[1] = b1;
    op[2] = c1;
    op[3] = d1;
    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  // Convert to int16_t. The C code checks that we are in range.
  op[0] = _mm_packs_epi32(op[0], op[1]);
  op[1] = _mm_packs_epi32(op[2], op[3]);

  // Load uint16_t.
  __m128i dst[2];
  __m128i tmp[4];
  tmp[0] = _mm_loadl_epi64((const __m128i *)(dest + 0 * stride));
  tmp[1] = _mm_loadl_epi64((const __m128i *)(dest + 1 * stride));
  dst[0] = _mm_unpacklo_epi64(tmp[0], tmp[1]);
  tmp[2] = _mm_loadl_epi64((const __m128i *)(dest + 2 * stride));
  tmp[3] = _mm_loadl_epi64((const __m128i *)(dest + 3 * stride));
  dst[1] = _mm_unpacklo_epi64(tmp[2], tmp[3]);

  // Add to the previous results.
  dst[0] = _mm_add_epi16(dst[0], op[0]);
  dst[1] = _mm_add_epi16(dst[1], op[1]);

  // Clamp.
  dst[0] = highbd_clamp_epi16(dst[0], bd);
  dst[1] = highbd_clamp_epi16(dst[1], bd);

  // Store.
  _mm_storel_epi64((__m128i *)(dest + 0 * stride), dst[0]);
  dst[0] = _mm_srli_si128(dst[0], 8);
  _mm_storel_epi64((__m128i *)(dest + 1 * stride), dst[0]);
  _mm_storel_epi64((__m128i *)(dest + 2 * stride), dst[1]);
  dst[1] = _mm_srli_si128(dst[1], 8);
  _mm_storel_epi64((__m128i *)(dest + 3 * stride), dst[1]);
}